

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEdit.cpp
# Opt level: O0

void __thiscall GraphEdit::calculateCellHeight(GraphEdit *this)

{
  int iVar1;
  int iVar2;
  QWidget *this_00;
  int value;
  QScrollBar *scrollbar;
  int local_20;
  int pagestep;
  int cellHeight;
  int newHeight;
  int range;
  int _height;
  GraphEdit *this_local;
  
  pagestep = availableHeight(this);
  iVar1 = (this->mMaxValue + 1) - this->mMinValue;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  if (iVar1 != 0) {
    local_20 = pagestep / iVar1;
    if ((this->mBarMode & 1U) == 0) {
      if (local_20 < 8) {
        local_20 = 8;
        iVar1 = QAbstractScrollArea::verticalScrollBar();
        QAbstractSlider::value();
        QAbstractSlider::pageStep();
        QAbstractSlider::setPageStep(iVar1);
        QAbstractSlider::setRange(iVar1,this->mMinValue);
        QAbstractSlider::setValue(iVar1);
        pagestep = (pagestep / 8) * 8;
      }
      else {
        iVar2 = QAbstractScrollArea::verticalScrollBar();
        QAbstractSlider::setRange(iVar2,0);
        pagestep = local_20 * iVar1;
      }
    }
    else {
      iVar1 = QAbstractScrollArea::verticalScrollBar();
      QAbstractSlider::setRange(iVar1,0);
    }
    this_00 = (QWidget *)QAbstractScrollArea::viewport();
    iVar1 = QWidget::height(this_00);
    QRect::setTop(&this->mPlotRect,(iVar1 - pagestep) / 2);
    QRect::setHeight(&this->mPlotRect,pagestep);
    if (local_20 == 0) {
      local_20 = 1;
    }
    this->mCellHeight = local_20;
  }
  return;
}

Assistant:

void GraphEdit::calculateCellHeight() {
    auto const _height = availableHeight();

    auto range = abs(mMaxValue + 1 - mMinValue);
    if (range) {
        int newHeight;
        auto cellHeight = _height / range;
        if (mBarMode) {
            verticalScrollBar()->setRange(0, 0);
            newHeight = _height;
        } else {
            if (cellHeight < TU::MIN_CELL_HEIGHT) {
                cellHeight = TU::MIN_CELL_HEIGHT;
                // idk why the -1 is needed but it works
                auto pagestep = (_height / TU::MIN_CELL_HEIGHT) - 1;
                auto scrollbar = verticalScrollBar();

                // keep the current value proportional to the new range
                auto value = scrollbar->value() + (scrollbar->pageStep() + 1) / 2 - (pagestep + 1) / 2;

                scrollbar->setPageStep(pagestep);
                scrollbar->setRange(mMinValue, mMaxValue - pagestep);
                scrollbar->setValue(value);
                newHeight = (pagestep + 1) * TU::MIN_CELL_HEIGHT;
            } else {
                verticalScrollBar()->setRange(0, 0);
                newHeight = cellHeight * range;
            }
        }
        
        mPlotRect.setTop((viewport()->height() - newHeight) / 2);
        mPlotRect.setHeight(newHeight);
        
        if (cellHeight == 0) {
            cellHeight = 1;
        }
        mCellHeight = cellHeight;
    }
}